

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

int vm_add_num(VM *vm,double num)

{
  int iVar1;
  int iVar2;
  Value *pVVar3;
  long lVar4;
  
  iVar2 = vm->consts_count;
  if (0 < (long)iVar2) {
    lVar4 = 0;
    do {
      if ((double)vm->consts[lVar4] == num) {
        return (int)lVar4;
      }
      lVar4 = lVar4 + 1;
    } while (iVar2 != lVar4);
  }
  iVar1 = vm->consts_capacity;
  if (iVar2 < iVar1) {
    pVVar3 = vm->consts;
  }
  else {
    vm->consts_capacity = iVar1 * 2;
    pVVar3 = (Value *)realloc(vm->consts,(long)iVar1 << 4);
    vm->consts = pVVar3;
    iVar2 = vm->consts_count;
  }
  vm->consts_count = iVar2 + 1;
  pVVar3[iVar2] = (Value)num;
  return iVar2;
}

Assistant:

int vm_add_num(VM *vm, double num) {
	uint64_t converted = n2v(num);

	// Check if the constant already exists
	for (int i = 0; i < vm->consts_count; i++) {
		if (vm->consts[i] == converted) {
			return i;
		}
	}

	// Resize the constants array if necessary
	if (vm->consts_count >= vm->consts_capacity) {
		vm->consts_capacity *= 2;
		vm->consts = realloc(vm->consts, sizeof(Value) * vm->consts_capacity);
	}

	// Add the converted number to the constants list if it doesn't already
	// exist
	vm->consts[vm->consts_count++] = converted;
	return vm->consts_count - 1;
}